

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_test.cpp
# Opt level: O0

void __thiscall StringPrintf_Precision_Test::TestBody(StringPrintf_Precision_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *file;
  char *expr1;
  char *expr2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  double dval;
  string e;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  float val;
  int length;
  string pi;
  StringToDoubleConverter floatParser;
  int *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  undefined4 uVar3;
  double *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  char *in_stack_fffffffffffffe68;
  int iVar4;
  string *expected_expression;
  double *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  Type type;
  AssertHelper *in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffec8;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult local_128 [2];
  undefined4 local_104;
  int *in_stack_ffffffffffffff00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  string local_e0 [48];
  AssertionResult local_b0 [2];
  undefined4 local_8c;
  AssertionResult local_88 [2];
  float local_64;
  undefined4 local_5c;
  string local_58 [32];
  StringToDoubleConverter local_38;
  
  double_conversion::StringToDoubleConverter::StringToDoubleConverter
            (&local_38,1,0.0,0.0,(char *)0x0,(char *)0x0,0);
  local_5c = 0x40490fdb;
  pbrt::StringPrintf<float>(in_stack_fffffffffffffe78,(float *)in_stack_fffffffffffffe70);
  std::__cxx11::string::data();
  std::__cxx11::string::size();
  local_64 = double_conversion::StringToDoubleConverter::StringToFloat
                       ((StringToDoubleConverter *)
                        CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                        (char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                        in_stack_fffffffffffffe48);
  local_8c = 0;
  testing::internal::CmpHelperNE<int,int>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (int *)in_stack_ffffffffffffff08.ptr_,in_stack_ffffffffffffff00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    testing::AssertionResult::failure_message((AssertionResult *)0x613594);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe80,(Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (char *)in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    testing::Message::~Message((Message *)0x6135f1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x613646);
  testing::internal::EqHelper<false>::Compare<float,float>
            (in_stack_fffffffffffffe68,
             (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             (float *)in_stack_fffffffffffffe58,
             (float *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  iVar4 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe80 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x6136db);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe80,(Type)((ulong)in_stack_fffffffffffffe78 >> 0x20),
               (char *)in_stack_fffffffffffffe70,iVar4,
               (char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    testing::Message::~Message((Message *)0x613738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x613790);
  expr1 = (char *)exp(1.0);
  pbrt::StringPrintf<double>(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  expected_expression = local_e0;
  file = (char *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  expr2 = (char *)double_conversion::StringToDoubleConverter::StringToDouble
                            ((StringToDoubleConverter *)
                             CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                             (char *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                             in_stack_fffffffffffffe48);
  local_104 = 0;
  testing::internal::CmpHelperNE<int,int>
            (expr1,expr2,(int *)in_stack_ffffffffffffff08.ptr_,in_stack_ffffffffffffff00);
  type = (Type)((ulong)expr2 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff00);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe58 =
         (double *)testing::AssertionResult::failure_message((AssertionResult *)0x6138d2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe80,type,file,(int)((ulong)expected_expression >> 0x20),
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    testing::Message::~Message((Message *)0x61392f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x613984);
  this_00 = (AssertHelper *)exp(1.0);
  testing::internal::EqHelper<false>::Compare<double,double>
            ((char *)expected_expression,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58,
             (double *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  iVar4 = (int)((ulong)expected_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_128);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe54);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    testing::AssertionResult::failure_message((AssertionResult *)0x613a30);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe80,type,file,iVar4,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffe60));
    testing::internal::AssertHelper::operator=(this_00,in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar3,in_stack_fffffffffffffe50));
    testing::Message::~Message((Message *)0x613a82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x613ad4);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

TEST(StringPrintf, Precision) {
    double_conversion::StringToDoubleConverter floatParser(
        double_conversion::StringToDoubleConverter::ALLOW_HEX,
        0. /* empty string value */, 0. /* junk string value */,
        nullptr /* infinity symbol */, nullptr /* NaN symbol */);

    std::string pi = StringPrintf("%f", float(Pi));
    int length;
    float val = floatParser.StringToFloat(pi.data(), pi.size(), &length);
    EXPECT_NE(0, length);
    EXPECT_EQ(val, Pi);

    std::string e = StringPrintf("%f", std::exp(1.));
    double dval = floatParser.StringToDouble(e.data(), e.size(), &length);
    EXPECT_NE(0, length);
    EXPECT_EQ(dval, std::exp(1.));
}